

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hb.c
# Opt level: O2

int heartbeat_init(heartbeat_context *hb,uint64_t window_size,heartbeat_record *window_buffer,
                  int log_fd,heartbeat_window_complete *hwc_callback)

{
  int *piVar1;
  int iVar2;
  
  if (((window_size == 0) || (hb == (heartbeat_context *)0x0)) ||
     (window_buffer == (heartbeat_record *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    iVar2 = -1;
  }
  else {
    (hb->ws).buffer_index = 0;
    (hb->ws).read_index = 0;
    (hb->ws).window_size = window_size;
    (hb->ws).log_fd = log_fd;
    hb->window_buffer = window_buffer;
    iVar2 = 0;
    memset(window_buffer,0,window_size * 0x60);
    hb->counter = 0;
    hb->lock = 0;
    hb->hwc_callback = hwc_callback;
    (hb->td).global = 0;
    (hb->td).window = 0;
    (hb->wd).global = 0;
    (hb->wd).window = 0;
  }
  return iVar2;
}

Assistant:

int heartbeat_init(heartbeat_context* hb,
                   uint64_t window_size,
                   heartbeat_record* window_buffer,
                   int log_fd,
                   heartbeat_window_complete* hwc_callback) {
  size_t record_size = sizeof(heartbeat_record);
#endif
  if (hb == NULL || window_buffer == NULL || window_size == 0) {
    errno = EINVAL;
    return -1;
  }

  hb->ws.buffer_index = 0;
  hb->ws.read_index = 0;
  hb->ws.window_size = window_size;
  hb->ws.log_fd = log_fd;
  hb->window_buffer = window_buffer;
  // cheap way to set initial values to 0 (necessary for managing window data)
  memset(hb->window_buffer, 0, window_size * record_size);
  hb->counter = 0;
  hb->lock = 0;
  hb->hwc_callback = hwc_callback;
  init_udata(&hb->td);
  init_udata(&hb->wd);
#if defined(HEARTBEAT_USE_ACC)
  init_udata(&hb->ad);
#endif
#if defined(HEARTBEAT_USE_POW)
  init_udata(&hb->ed);
#endif

  return 0;
}